

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Aggregate_State_PDU
          (Aggregate_State_PDU *this,Header *H,KDataStream *stream)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header6_00222530;
  KVar1 = (H->super_Header6).m_ui8ExerciseID;
  KVar2 = (H->super_Header6).m_ui8PDUType;
  KVar3 = (H->super_Header6).m_ui8ProtocolFamily;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = (H->super_Header6).m_ui8ProtocolVersion;
  (this->super_Header).super_Header6.m_ui8ExerciseID = KVar1;
  (this->super_Header).super_Header6.m_ui8PDUType = KVar2;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar3;
  (this->super_Header).super_Header6.m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__TimeStamp_00221d80;
  (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
       (H->super_Header6).m_TimeStamp.m_TimeStampUnion;
  (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (H->super_Header6).m_TimeStamp.m_bAutoCalcRel;
  KVar1 = (H->super_Header6).m_ui8Padding1;
  KVar2 = (H->super_Header6).m_ui8Padding2;
  (this->super_Header).super_Header6.m_ui16PDULength = (H->super_Header6).m_ui16PDULength;
  (this->super_Header).super_Header6.m_ui8Padding1 = KVar1;
  (this->super_Header).super_Header6.m_ui8Padding2 = KVar2;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header7_00222580;
  (this->super_Header).super_Header6.field_0x26 = (H->super_Header6).field_0x26;
  *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
       *(undefined2 *)&(H->super_Header6).field_0x24;
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Aggregate_State_PDU_00222a08;
  DATA_TYPE::AggregateIdentifier::AggregateIdentifier(&this->m_AggregateID);
  DATA_TYPE::AggregateType::AggregateType(&this->m_AggregateType);
  DATA_TYPE::AggregateMarking::AggregateMarking(&this->m_AggregateMarking);
  DATA_TYPE::Vector::Vector(&this->m_Dimensions);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_CtrOfMassLoc);
  DATA_TYPE::Vector::Vector(&this->m_Vel);
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Aggregate_State_PDU::Aggregate_State_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}